

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_3::traverseProgramVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,Program *program,string *path,VariableSearchFilter *filter)

{
  Shader *shader_00;
  bool bVar1;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar2;
  size_type sVar3;
  const_reference ppSVar4;
  Shader *shader;
  int shaderNdx;
  VariableSearchFilter *filter_local;
  string *path_local;
  Program *program_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *typePath_local;
  
  shader._4_4_ = 0;
  do {
    pvVar2 = ProgramInterfaceDefinition::Program::getShaders(program);
    sVar3 = std::
            vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ::size(pvVar2);
    if ((int)sVar3 <= shader._4_4_) {
      return false;
    }
    pvVar2 = ProgramInterfaceDefinition::Program::getShaders(program);
    ppSVar4 = std::
              vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
              ::operator[](pvVar2,(long)shader._4_4_);
    shader_00 = *ppSVar4;
    bVar1 = ProgramInterfaceDefinition::VariableSearchFilter::matchesFilter(filter,shader_00);
    if (bVar1) {
      std::
      vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
      ::clear(typePath);
      bVar1 = traverseShaderVariablePath(typePath,shader_00,path,filter);
      if (bVar1) {
        return true;
      }
    }
    shader._4_4_ = shader._4_4_ + 1;
  } while( true );
}

Assistant:

static bool traverseProgramVariablePath (std::vector<VariablePathComponent>& typePath, const ProgramInterfaceDefinition::Program* program, const std::string& path, const VariableSearchFilter& filter)
{
	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* shader = program->getShaders()[shaderNdx];

		if (filter.matchesFilter(shader))
		{
			// \note modifying output variable even when returning false
			typePath.clear();
			if (traverseShaderVariablePath(typePath, shader, path, filter))
				return true;
		}
	}

	return false;
}